

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O0

int __thiscall Bezier::init(Bezier *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  pair<Polynomial,_Polynomial> *this_00;
  size_t *siglen;
  size_t *siglen_00;
  size_t *siglen_01;
  Vector3 *sig;
  size_t in_R8;
  double dVar3;
  double dVar4;
  BoundingBox *this_01;
  Vector3 *pVVar5;
  float dv;
  float j;
  float v;
  float du;
  float i_1;
  float u;
  pair<Polynomial,_Polynomial> tmp;
  Vector3 *i;
  iterator __end1;
  iterator __begin1;
  vector<Vector3,_std::allocator<Vector3>_> *__range1;
  BoundingBox *in_stack_fffffffffffffe38;
  Vector3 *in_stack_fffffffffffffe40;
  Vector3 *in_stack_fffffffffffffe48;
  Vector3 *in_stack_fffffffffffffe50;
  Vector3 *in_stack_fffffffffffffe58;
  Polynomial *in_stack_fffffffffffffe60;
  Vector3 *in_stack_fffffffffffffe98;
  Vector3 local_158;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  reference local_c8;
  Vector3 *local_c0;
  __normal_iterator<Vector3_*,_std::vector<Vector3,_std::allocator<Vector3>_>_> local_b8;
  vector<Vector3,_std::allocator<Vector3>_> *local_b0;
  double local_a8;
  double local_a0;
  double in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  Bezier *in_stack_ffffffffffffff78;
  Vector3 local_80;
  Vector3 local_68;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Bezier *in_stack_ffffffffffffffb8;
  double local_40;
  Vector3 local_38;
  Vector3 local_20;
  Bezier *local_8;
  
  local_8 = this;
  printf("initializing Bezier\n");
  sig = &this->Dz;
  Vector3::normalized(in_stack_fffffffffffffe58);
  (this->Dz).x = local_20.x;
  (this->Dz).y = local_20.y;
  (this->Dz).z = local_20.z;
  pVVar5 = &local_20;
  Vector3::~Vector3(pVVar5);
  iVar2 = sign((EVP_PKEY_CTX *)pVVar5,(uchar *)sig,siglen,(uchar *)local_20.z,in_R8);
  if (iVar2 == 0) {
    iVar2 = sign((EVP_PKEY_CTX *)pVVar5,(uchar *)sig,siglen_00,(uchar *)local_20.z,in_R8);
    if (iVar2 == 0) {
      iVar2 = sign((EVP_PKEY_CTX *)pVVar5,(uchar *)sig,siglen_01,(uchar *)local_20.z,in_R8);
      if (iVar2 == 0) {
        Vector3::Vector3(&local_38,1.0,0.0,0.0);
        (this->Dx).x = local_38.x;
        (this->Dx).y = local_38.y;
        (this->Dx).z = local_38.z;
        Vector3::~Vector3(&local_38);
        goto LAB_0012c366;
      }
    }
  }
  in_stack_fffffffffffffe98 = &local_80;
  Vector3::Vector3(in_stack_fffffffffffffe98,0.0,1.0,0.0);
  Vector3::cross(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Vector3::normalized(in_stack_fffffffffffffe58);
  (this->Dx).x = (double)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  (this->Dx).y = (double)in_stack_ffffffffffffffb8;
  (this->Dx).z = local_40;
  Vector3::~Vector3((Vector3 *)&stack0xffffffffffffffb0);
  Vector3::~Vector3(&local_68);
  Vector3::~Vector3(&local_80);
LAB_0012c366:
  Vector3::cross(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  (this->Dy).x = local_a8;
  (this->Dy).y = local_a0;
  (this->Dy).z = in_stack_ffffffffffffff68;
  Vector3::~Vector3((Vector3 *)&local_a8);
  local_b0 = &this->control_points;
  local_b8._M_current =
       (Vector3 *)
       std::vector<Vector3,_std::allocator<Vector3>_>::begin
                 ((vector<Vector3,_std::allocator<Vector3>_> *)in_stack_fffffffffffffe38);
  local_c0 = (Vector3 *)
             std::vector<Vector3,_std::allocator<Vector3>_>::end
                       ((vector<Vector3,_std::allocator<Vector3>_> *)in_stack_fffffffffffffe38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Vector3_*,_std::vector<Vector3,_std::allocator<Vector3>_>_>
                        *)in_stack_fffffffffffffe40,
                       (__normal_iterator<Vector3_*,_std::vector<Vector3,_std::allocator<Vector3>_>_>
                        *)in_stack_fffffffffffffe38);
    if (!bVar1) break;
    local_c8 = __gnu_cxx::
               __normal_iterator<Vector3_*,_std::vector<Vector3,_std::allocator<Vector3>_>_>::
               operator*(&local_b8);
    operator/=(in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->x);
    __gnu_cxx::__normal_iterator<Vector3_*,_std::vector<Vector3,_std::allocator<Vector3>_>_>::
    operator++(&local_b8);
  }
  std::vector<Vector3,_std::allocator<Vector3>_>::size(&this->control_points);
  P2d(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  Polynomial::operator=
            ((Polynomial *)in_stack_fffffffffffffe40,(Polynomial *)in_stack_fffffffffffffe38);
  Polynomial::operator=
            ((Polynomial *)in_stack_fffffffffffffe40,(Polynomial *)in_stack_fffffffffffffe38);
  Polynomial::derivative((Polynomial *)in_stack_fffffffffffffe98);
  Polynomial::operator=
            ((Polynomial *)in_stack_fffffffffffffe40,(Polynomial *)in_stack_fffffffffffffe38);
  Polynomial::~Polynomial((Polynomial *)0x12c4ff);
  Polynomial::derivative((Polynomial *)in_stack_fffffffffffffe98);
  Polynomial::operator=
            ((Polynomial *)in_stack_fffffffffffffe40,(Polynomial *)in_stack_fffffffffffffe38);
  Polynomial::~Polynomial((Polynomial *)0x12c542);
  dVar3 = Polynomial::operator()(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
  dVar4 = Polynomial::operator()(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0,dVar3,dVar4);
  dVar3 = Polynomial::operator()(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
  this_01 = (BoundingBox *)
            Polynomial::operator()(in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0x3fe0000000000000,dVar3,this_01);
  pVVar5 = (Vector3 *)
           Polynomial::operator()((Polynomial *)this_01,(double)in_stack_fffffffffffffe58);
  dVar3 = Polynomial::operator()((Polynomial *)this_01,(double)pVVar5);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0x3ff0000000000000,pVVar5,dVar3);
  std::operator<<((ostream *)&std::cout,"Bezier points:\n");
  local_130 = 0.0;
  local_134 = 0.01;
  for (local_12c = 0.0; local_12c <= 1.0; local_12c = local_134 + local_12c) {
    local_13c = 0.0;
    local_140 = 0.01;
    for (local_138 = 0.0; local_138 <= 1.0; local_138 = local_140 + local_138) {
      getPoint(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      BoundingBox::include(this_01,pVVar5);
      Vector3::~Vector3(&local_158);
      local_13c = local_13c + 1.0;
    }
    local_130 = local_130 + 1.0;
  }
  this_00 = (pair<Polynomial,_Polynomial> *)
            operator<<((ostream *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::pair<Polynomial,_Polynomial>::~pair(this_00);
  return extraout_EAX;
}

Assistant:

void Bezier::init()
{
    printf("initializing Bezier\n");
    Dz = Dz.normalized();
    if (!sign(Dz.x) && !sign(Dz.y - 1) && !sign(Dz.z)) Dx = Vector3(1, 0, 0);
    else Dx = Vector3(0, 1, 0).cross(Dz).normalized();
    Dy = Dz.cross(Dx);
    for (auto &i :control_points) i /= S;
    std::pair<Polynomial, Polynomial> tmp = P2d(0, control_points.size());
    px = tmp.first; py = tmp.second;
    dpx = px.derivative(); dpy = py.derivative();
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 0., px(0), py(0));
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 0.5, px(0.5), py(0.5));
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 1., px(1), py(1));
    std::cout << "Bezier points:\n";
    for (float u = 0.0f, i = 0, du = 0.01; u <= 1.0f; u += du, i++) {
        for (float v = 0.0f, j = 0, dv = 0.01; v <= 1.0f; v += dv, j++) {
            bbox.include(getPoint(u, v * 2 * PI));
        }
    }
    std::cout << bbox << std::endl;
}